

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O3

void save_load_regularizer(vw *all,bfgs *b,io_buf *model_file,bool read,bool text)

{
  float *data;
  float fVar1;
  weight *pwVar2;
  size_t sVar3;
  size_t sVar4;
  ostream *poVar5;
  ulong uVar6;
  uint32_t i;
  stringstream msg;
  uint local_1c8;
  uint local_1c4;
  vw *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_1c4 = 2 << ((byte)all->num_bits & 0x1f);
  local_1c8 = 0;
  local_1c0 = all;
  if (b->output_regularizer == true && !read) {
    preconditioner_to_regularizer(b->all,b,b->all->l2_lambda);
  }
  do {
    while (read) {
      sVar3 = io_buf::bin_read_fixed(model_file,(char *)&local_1c8,4,"");
      if ((sVar3 == 0) ||
         (sVar4 = io_buf::bin_read_fixed(model_file,(char *)(b->regularizers + local_1c8),4,""),
         sVar3 + sVar4 == 0)) {
        regularizer_to_weight(local_1c0,b);
        return;
      }
    }
    pwVar2 = b->regularizers;
    uVar6 = (ulong)local_1c8;
    fVar1 = pwVar2[uVar6];
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      bin_text_write_fixed(model_file,(char *)&local_1c8,4,(stringstream *)local_1b8,text);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      data = pwVar2 + uVar6;
      poVar5 = std::ostream::_M_insert<double>((double)*data);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      bin_text_write_fixed(model_file,(char *)data,4,(stringstream *)local_1b8,text);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    }
    local_1c8 = local_1c8 + 1;
  } while (local_1c8 < local_1c4);
  return;
}

Assistant:

void save_load_regularizer(vw& all, bfgs& b, io_buf& model_file, bool read, bool text)
{
  int c = 0;
  uint32_t length = 2 * (1 << all.num_bits);
  uint32_t i = 0;
  size_t brw = 1;

  if (b.output_regularizer && !read)
    preconditioner_to_regularizer(*(b.all), b, b.all->l2_lambda);

  do
  {
    brw = 1;
    weight* v;
    if (read)
    {
      c++;
      brw = model_file.bin_read_fixed((char*)&i, sizeof(i), "");
      if (brw > 0)
      {
        assert(i < length);
        v = &(b.regularizers[i]);
        brw += model_file.bin_read_fixed((char*)v, sizeof(*v), "");
      }
    }
    else  // write binary or text
    {
      v = &(b.regularizers[i]);
      if (*v != 0.)
      {
        c++;
        stringstream msg;
        msg << i;
        brw = bin_text_write_fixed(model_file, (char*)&i, sizeof(i), msg, text);

        msg << ":" << *v << "\n";
        brw += bin_text_write_fixed(model_file, (char*)v, sizeof(*v), msg, text);
      }
    }
    if (!read)
      i++;
  } while ((!read && i < length) || (read && brw > 0));

  if (read)
    regularizer_to_weight(all, b);
}